

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-obj-list.c
# Opt level: O3

void object_list_format_section
               (object_list_t *list,textblock *tb,object_list_section_t section,
               wchar_t lines_to_display,wchar_t max_width,char *prefix,_Bool show_others,
               size_t *max_width_result)

{
  ushort uVar1;
  ushort uVar2;
  object_list_entry_t *poVar3;
  object_kind *kind;
  _Bool _Var4;
  uint8_t uVar5;
  ushort uVar6;
  wchar_t c;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  ushort uVar10;
  ulong uVar11;
  long lVar12;
  wchar_t wVar13;
  char *pcVar14;
  char *pcVar15;
  ulong uVar16;
  size_t sVar17;
  ulong local_150;
  char location [20];
  char line_buffer [200];
  
  pcVar14 = ":";
  if (lines_to_display == L'\0') {
    pcVar14 = ".";
  }
  pcVar7 = "other ";
  if (!show_others) {
    pcVar7 = "";
  }
  if (list->entries != (object_list_entry_t *)0x0) {
    uVar11 = (ulong)section;
    uVar1 = list->total_entries[uVar11];
    if (uVar1 == 0) {
      sVar8 = strnfmt(line_buffer,200,"%s no objects.\n",prefix);
      if (tb != (textblock *)0x0) {
        textblock_append(tb,"%s",line_buffer);
      }
      if (max_width_result != (size_t *)0x0) {
        sVar17 = 0x28;
        if (0x28 < sVar8) {
          sVar17 = sVar8;
        }
        *max_width_result = sVar17;
      }
    }
    else {
      uVar2 = list->distinct_entries;
      pcVar15 = "s";
      if (uVar1 == 1) {
        pcVar15 = "";
      }
      uVar16 = 0;
      local_150 = strnfmt(line_buffer,200,"%s %d %sobject%s%s\n",prefix,(ulong)uVar1,pcVar7,pcVar15,
                          pcVar14);
      if (tb != (textblock *)0x0) {
        textblock_append(tb,"%s",line_buffer);
      }
      if (L'\0' < lines_to_display && uVar2 != 0) {
        lVar12 = 0;
        uVar16 = 0;
        wVar13 = L'\0';
        do {
          location[0] = '\0';
          location[1] = '\0';
          location[2] = '\0';
          location[3] = '\0';
          location[4] = '\0';
          location[5] = '\0';
          location[6] = '\0';
          location[7] = '\0';
          location[8] = '\0';
          location[9] = '\0';
          location[10] = '\0';
          location[0xb] = '\0';
          location[0xc] = '\0';
          location[0xd] = '\0';
          location[0xe] = '\0';
          location[0xf] = '\0';
          location[0x10] = '\0';
          location[0x11] = '\0';
          location[0x12] = '\0';
          location[0x13] = '\0';
          poVar3 = list->entries;
          line_buffer[0] = '\0';
          if (*(short *)((long)poVar3->count + uVar11 * 2 + lVar12) != 0) {
            pcVar14 = "E";
            if (*(short *)((long)poVar3->count + lVar12 + 4) < 1) {
              pcVar14 = "W";
            }
            pcVar7 = "S";
            if (*(short *)((long)poVar3->count + lVar12 + 6) < 1) {
              pcVar7 = "N";
            }
            uVar1 = *(ushort *)((long)poVar3->count + lVar12 + 4);
            uVar6 = *(ushort *)((long)poVar3->count + lVar12 + 6);
            uVar10 = -uVar6;
            if (0 < (short)uVar6) {
              uVar10 = uVar6;
            }
            uVar6 = -uVar1;
            if (0 < (short)uVar1) {
              uVar6 = uVar1;
            }
            strnfmt(location,0x14," %d %s %d %s",(ulong)uVar10,pcVar7,(ulong)uVar6,pcVar14);
            sVar8 = utf8_strlen(location);
            sVar17 = ~sVar8 + (long)(max_width + L'\xfffffffe');
            object_list_format_name
                      ((object_list_entry_t *)((long)list->entries->count + lVar12 + -8),line_buffer
                       ,200);
            utf8_clipto(line_buffer,sVar17);
            sVar8 = utf8_strlen(line_buffer);
            if (local_150 < sVar8 + 0xe) {
              local_150 = utf8_strlen(line_buffer);
              local_150 = local_150 + 0xe;
            }
            if (((tb == (textblock *)0x0) || (tile_width != '\x01')) || (tile_height != '\x01')) {
              if (tb != (textblock *)0x0) goto LAB_001f7b85;
            }
            else {
              _Var4 = is_unknown(*(object **)((long)list->entries->count + lVar12 + -8));
              c = L'*';
              uVar5 = '\x04';
              if ((!_Var4) &&
                 (kind = (object_kind *)**(undefined8 **)((long)list->entries->count + lVar12 + -8),
                 kind != (object_kind *)0x0)) {
                uVar5 = object_kind_attr(kind);
                c = object_kind_char((object_kind *)
                                     **(undefined8 **)((long)list->entries->count + lVar12 + -8));
              }
              textblock_append_pict(tb,uVar5,c);
              textblock_append(tb," ");
LAB_001f7b85:
              sVar9 = strlen(line_buffer);
              sVar8 = utf8_strlen(line_buffer);
              uVar5 = object_list_entry_line_attribute
                                ((object_list_entry_t *)((long)list->entries->count + lVar12 + -8));
              textblock_append_c(tb,uVar5,"%-*s%s\n",
                                 (ulong)(uint)(((int)sVar9 + (int)sVar17) - (int)sVar8),line_buffer,
                                 location);
            }
            wVar13 = wVar13 + L'\x01';
          }
          uVar16 = uVar16 + 1;
        } while ((uVar16 < uVar2) && (lVar12 = lVar12 + 0x10, wVar13 < lines_to_display));
      }
      if (max_width_result != (size_t *)0x0) {
        *max_width_result = local_150;
      }
      if (((L'\0' < lines_to_display) && (tb != (textblock *)0x0)) &&
         ((uint)lines_to_display < (uint)list->total_entries[uVar11])) {
        textblock_append(tb,"%6s...and %d others.\n"," ",(ulong)((uint)uVar2 - (int)uVar16));
      }
    }
  }
  return;
}

Assistant:

static void object_list_format_section(const object_list_t *list,
									   textblock *tb,
									   object_list_section_t section,
									   int lines_to_display, int max_width,
									   const char *prefix, bool show_others,
									   size_t *max_width_result)
{
	int remaining_object_total = 0;
	int line_count = 0;
	int entry_index;
	int total;
	char line_buffer[200];
	const char *punctuation = (lines_to_display == 0) ? "." : ":";
	const char *others = (show_others) ? "other " : "";
	size_t max_line_length = 0;

	if (list == NULL || list->entries == NULL)
		return;

	total = list->distinct_entries;

	if (list->total_entries[section] == 0) {
		max_line_length = strnfmt(line_buffer, sizeof(line_buffer),
								  "%s no objects.\n", prefix);

		if (tb != NULL)
			textblock_append(tb, "%s", line_buffer);

		/* Force a minimum width so that the prompt doesn't get cut off. */
		if (max_width_result != NULL)
			*max_width_result = MAX(max_line_length, 40);

		return;
	}

	max_line_length = strnfmt(line_buffer, sizeof(line_buffer),
							  "%s %d %sobject%s%s\n", prefix,
							  list->total_entries[section], others,
							  PLURAL(list->total_entries[section]),
							  punctuation);

	if (tb != NULL)
		textblock_append(tb, "%s", line_buffer);

	for (entry_index = 0; entry_index < total && line_count < lines_to_display;
		 entry_index++) {
		char location[20] = { '\0' };
		uint8_t line_attr;
		size_t full_width;
		const char *direction_y = (list->entries[entry_index].dy <= 0) ? "N" : "S";
		const char *direction_x = (list->entries[entry_index].dx <= 0) ? "W" : "E";

		line_buffer[0] = '\0';

		if (list->entries[entry_index].count[section] == 0)
			continue;

		/* Build the location string. */
		strnfmt(location, sizeof(location), " %d %s %d %s",
				abs(list->entries[entry_index].dy), direction_y,
				abs(list->entries[entry_index].dx), direction_x);

		/* Get width available for object name: 2 for char and space; location
		 * includes padding; last -1 for some reason? */
		full_width = max_width - 2 - utf8_strlen(location) - 1;

		/* Add the object count and clip the object name to fit. */
		object_list_format_name(&list->entries[entry_index], line_buffer,
								sizeof(line_buffer));
		utf8_clipto(line_buffer, full_width);

		/* Calculate the width of the line for dynamic sizing; use a fixed max
		 * width for location and object char. */
		max_line_length = MAX(max_line_length,
							  utf8_strlen(line_buffer) + 12 + 2);

		/* textblock_append_pict will safely add the object symbol, regardless
		 * of ASCII/graphics mode. */
		if (tb != NULL && tile_width == 1 && tile_height == 1) {
			uint8_t a = COLOUR_RED;
			wchar_t c = L'*';

			if (!is_unknown(list->entries[entry_index].object) &&
				list->entries[entry_index].object->kind != NULL) {
				a = object_kind_attr(list->entries[entry_index].object->kind);
				c = object_kind_char(list->entries[entry_index].object->kind);
			}

			textblock_append_pict(tb, a, c);
			textblock_append(tb, " ");
		}

		/* Add the left-aligned and padded object name which will align the
		 * location to the right. */
		if (tb != NULL) {
			/*
			 * Hack - Because object name strings are UTF8, we have to add
			 * additional padding for any raw bytes that might be consolidated
			 * into one displayed character.
			 */
			full_width += strlen(line_buffer) - utf8_strlen(line_buffer);
			line_attr = object_list_entry_line_attribute(&list->entries[entry_index]);
			textblock_append_c(tb, line_attr, "%-*s%s\n",
				(int) full_width, line_buffer, location);
		}

		line_count++;
	}

	/* Don't worry about the "...others" line, since it's probably shorter than
	 * what's already printed. */
	if (max_width_result != NULL)
		*max_width_result = max_line_length;

	/* Bail since we don't have enough room to display the remaining count or
	 * since we've displayed them all. */
	if (lines_to_display <= 0 ||
		lines_to_display >= list->total_entries[section])
		return;

	/* Count the remaining objects, starting where we left off in the above
	 * loop. */
	remaining_object_total = total - entry_index;

	if (tb != NULL)
		textblock_append(tb, "%6s...and %d others.\n", " ", remaining_object_total);
}